

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O3

bool removeUtf8Char(string *value,size_t position)

{
  ulong uVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  const_iterator it;
  iterator it_2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [2];
  long local_40 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  uVar1 = value->_M_string_length;
  if (position < uVar1) {
    iVar3 = (int)position + -1;
    pcVar2 = (value->_M_dataplus)._M_p;
    _Var5._M_current = pcVar2;
    local_50[0]._M_current = pcVar2;
    if (0 < iVar3) {
      do {
        pcVar2 = (value->_M_dataplus)._M_p;
        _Var5._M_current = pcVar2 + value->_M_string_length;
        if (local_50[0]._M_current == pcVar2 + value->_M_string_length) goto LAB_001813f5;
        utf8::unchecked::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (local_50);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      pcVar2 = (value->_M_dataplus)._M_p;
      _Var5._M_current = local_50[0]._M_current;
    }
LAB_001813f5:
    if ((long)_Var5._M_current - (long)pcVar2 == 0xffffffffffffffff) {
      return false;
    }
    if ((value->_M_string_length != 0) && (local_50[0]._M_current = pcVar2, 0 < (int)position)) {
      do {
        if (local_50[0]._M_current == (value->_M_dataplus)._M_p + value->_M_string_length) break;
        utf8::unchecked::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (local_50);
        uVar4 = (int)position - 1;
        position = (size_t)uVar4;
      } while (uVar4 != 0);
    }
    std::__cxx11::string::erase((ulong)value,(long)_Var5._M_current - (long)pcVar2);
  }
  else {
    start._M_current = (value->_M_dataplus)._M_p;
    local_30._M_current = start._M_current + uVar1;
    if (uVar1 == 0) {
      return false;
    }
    utf8::prior<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(&local_30,start);
    local_50[0]._M_current = (char *)local_40;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_50,(value->_M_dataplus)._M_p,local_30._M_current);
    std::__cxx11::string::operator=((string *)value,(string *)local_50);
    if ((long *)local_50[0]._M_current != local_40) {
      operator_delete(local_50[0]._M_current,local_40[0] + 1);
    }
  }
  return true;
}

Assistant:

inline static bool removeUtf8Char(std::string& value, size_t position) {
    /* optimize the normal case, at the end... */
    if (position >= value.size()) {
        std::string::iterator it = value.end();
        const std::string::iterator start = value.begin();
        if (it != start) {
            utf8::prior(it, start);
            value = std::string(value.begin(), it);
            return true;
        }
    }
    else {
        const size_t offset = u8offset(value, position - 1);
        if (offset != std::string::npos) {
            const size_t end = u8offset(value, position);
            value.erase(offset, end - offset);
            return true;
        }
    }

    return false;
}